

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

iterator * __thiscall Catch::TextFlow::Columns::iterator::operator++(iterator *this)

{
  pointer pcVar1;
  vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *pvVar2;
  pointer pCVar3;
  long lVar4;
  ulong uVar5;
  
  pvVar2 = this->m_columns;
  pCVar3 = (pvVar2->
           super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((pvVar2->super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
      )._M_impl.super__Vector_impl_data._M_finish != pCVar3) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      pcVar1 = (this->m_iterators).
               super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((*(long *)((long)&(pcVar1->m_lineStart).m_it._M_current + lVar4) !=
           *(long *)((long)&(pCVar3->m_string).m_string._M_dataplus._M_p + lVar4) +
           *(long *)((long)&(pCVar3->m_string).m_string._M_string_length + lVar4)) ||
         ((long)&(pCVar3->m_string).m_string._M_dataplus._M_p + lVar4 !=
          *(long *)((long)&pcVar1->m_column + lVar4))) {
        Column::const_iterator::operator++((const_iterator *)((long)&pcVar1->m_column + lVar4));
        pvVar2 = this->m_columns;
        pCVar3 = (pvVar2->
                 super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x40;
    } while (uVar5 < (ulong)((long)(pvVar2->
                                   super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 6))
    ;
  }
  return this;
}

Assistant:

Columns::iterator& Columns::iterator::operator++() {
            for ( size_t i = 0; i < m_columns.size(); ++i ) {
                if ( m_iterators[i] != m_columns[i].end() ) {
                    ++m_iterators[i];
                }
            }
            return *this;
        }